

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O1

void __thiscall
gimage::TIFFImageIO::load
          (TIFFImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  long lVar1;
  uchar ***pppuVar2;
  size_type sVar3;
  size_type sVar4;
  uchar *puVar5;
  uchar **ppuVar6;
  int iVar7;
  _Alloc_hider _Var8;
  long *plVar9;
  IOException *pIVar10;
  long lVar11;
  size_type *psVar12;
  long lVar13;
  uint16_t d;
  ulong uVar14;
  uint16_t planar;
  uint16_t format;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pixel;
  TiffImage<unsigned_char> tif;
  allocator local_1f9;
  ulong local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [32];
  uchar *local_1b0;
  uchar **ppuStack_1a8;
  uchar ***local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  long local_178;
  long local_170;
  ulong local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  TiffImage<unsigned_char> local_140;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_140.rows.depth = 0;
  local_140.rows.width = 0;
  local_140.rows.height = 0;
  local_140.rows.n = 0;
  local_140.rows.pixel = (uchar *)0x0;
  local_140.rows.row = (uchar **)0x0;
  local_140.rows.img = (uchar ***)0x0;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(&local_140.rows,0,0,1);
  local_140.raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_140.raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_140.row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_140.raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_140.row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_140.row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_140.tif = (TIFF *)TIFFOpen(name,"r");
  if (local_140.tif == (TIFF *)0x0) {
    pIVar10 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_198,name,(allocator *)&local_160);
    std::operator+(&local_1f0,"Can only load TIFF image (",&local_198);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_1f0);
    local_1d0._0_8_ = *plVar9;
    psVar12 = (size_type *)(plVar9 + 2);
    if ((size_type *)local_1d0._0_8_ == psVar12) {
      local_1d0._16_8_ = *psVar12;
      local_1d0._24_8_ = plVar9[3];
      local_1d0._0_8_ = local_1d0 + 0x10;
    }
    else {
      local_1d0._16_8_ = *psVar12;
    }
    local_1d0._8_8_ = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    gutil::IOException::IOException(pIVar10,(string *)local_1d0);
    __cxa_throw(pIVar10,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  TIFFGetField(local_140.tif,0x100,&local_140.width);
  TIFFGetField(local_140.tif,0x101);
  TIFFGetField(local_140.tif,0x115);
  TIFFGetField(local_140.tif,0x102);
  TIFFGetField(local_140.tif,0x153,local_1d0);
  TIFFGetField(local_140.tif,0x11c,&local_1f0);
  local_140.is_float = local_1d0._0_2_ == 3;
  local_140.is_planar = (short)local_1f0._M_dataplus._M_p == 2;
  local_140.raw_size = TIFFScanlineSize(local_140.tif);
  TIFFGetField(local_140.tif,0x106);
  if (8 < local_140.bits) {
    pIVar10 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_70,name,&local_1f9);
    std::operator+(&local_50,"Image ",&local_70);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_160._M_dataplus._M_p = (pointer)*plVar9;
    psVar12 = (size_type *)(plVar9 + 2);
    if ((size_type *)local_160._M_dataplus._M_p == psVar12) {
      local_160.field_2._M_allocated_capacity = *psVar12;
      local_160.field_2._8_8_ = plVar9[3];
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar12;
    }
    local_160._M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::to_string(&local_90,(uint)local_140.bits);
    std::operator+(&local_198,&local_160,&local_90);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_198);
    local_1f0._M_dataplus._M_p = (pointer)*plVar9;
    psVar12 = (size_type *)(plVar9 + 2);
    if ((size_type *)local_1f0._M_dataplus._M_p == psVar12) {
      local_1f0.field_2._M_allocated_capacity = *psVar12;
      local_1f0.field_2._8_8_ = plVar9[3];
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    }
    else {
      local_1f0.field_2._M_allocated_capacity = *psVar12;
    }
    local_1f0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::to_string(&local_b0,8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                   &local_1f0,&local_b0);
    gutil::IOException::IOException(pIVar10,(string *)local_1d0);
    __cxa_throw(pIVar10,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_1f8 = w;
  if (w < 0) {
    local_1f8 = (ulong)((local_140.width + ds) - 1) / (ulong)(uint)ds;
  }
  if (h < 0) {
    h = (ulong)((local_140.height + ds) - 1) / (ulong)(uint)ds;
  }
  if (local_140.photometric < 3) {
    local_168 = (ulong)(uint)ds;
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              (image,(ulong)local_140.width,(ulong)local_140.height,(ulong)local_140.depth);
    local_178 = x;
    local_170 = y;
    if (local_140.is_planar == false) {
      if (h != 0) {
        uVar14 = 0;
        do {
          anon_unknown_6::readRow<unsigned_char>
                    (image,(uint32_t)uVar14,&local_140,(uint32_t)uVar14,0);
          uVar14 = uVar14 + 1;
        } while (h != uVar14);
      }
    }
    else if (local_140.depth != 0) {
      d = 0;
      do {
        if (h != 0) {
          uVar14 = 0;
          do {
            anon_unknown_6::readRow<unsigned_char>
                      (image,(uint32_t)uVar14,&local_140,(uint32_t)uVar14,d);
            uVar14 = uVar14 + 1;
          } while (h != uVar14);
        }
        d = d + 1;
      } while (d < local_140.depth);
    }
    lVar13 = local_170;
    lVar11 = local_178;
    if (1 < (int)local_168) {
      downscaleImage<unsigned_char>
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)local_1d0,image,
                 (int)local_168);
      iVar7 = image->depth;
      image->depth = local_1d0._0_4_;
      local_1d0._0_4_ = iVar7;
      sVar3 = image->width;
      sVar4 = image->height;
      image->width = local_1d0._8_8_;
      image->height = local_1d0._16_8_;
      lVar1 = image->n;
      image->n = local_1d0._24_8_;
      puVar5 = image->pixel;
      ppuVar6 = image->row;
      image->pixel = local_1b0;
      image->row = ppuStack_1a8;
      pppuVar2 = image->img;
      image->img = local_1a0;
      local_1d0._8_8_ = sVar3;
      local_1d0._16_8_ = sVar4;
      local_1d0._24_8_ = lVar1;
      local_1b0 = puVar5;
      ppuStack_1a8 = ppuVar6;
      local_1a0 = pppuVar2;
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)local_1d0);
    }
    if (((lVar13 == 0 && lVar11 == 0) && (local_1f8 == image->width)) && (h == image->height))
    goto LAB_00139ee9;
    cropImage<unsigned_char>
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)local_1d0,image,lVar11,
               lVar13,local_1f8,h);
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_198,
               (ulong)(local_140.height * local_140.width),(allocator_type *)local_1d0);
    iVar7 = TIFFReadRGBAImageOriented
                      (local_140.tif,local_140.width,local_140.height,local_198._M_dataplus._M_p,1,1
                      );
    if (iVar7 < 1) {
      pIVar10 = (IOException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_1f0,name,(allocator *)&local_160);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                     "Cannot load image ",&local_1f0);
      gutil::IOException::IOException(pIVar10,(string *)local_1d0);
      __cxa_throw(pIVar10,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    }
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              (image,(ulong)local_140.width,(ulong)local_140.height,3);
    if (0 < image->height) {
      lVar11 = 0;
      _Var8._M_p = local_198._M_dataplus._M_p;
      do {
        if (0 < image->width) {
          lVar13 = 0;
          do {
            (*image->img)[lVar11][lVar13] = *_Var8._M_p;
            image->img[1][lVar11][lVar13] = ((uchar *)_Var8._M_p)[1];
            image->img[2][lVar11][lVar13] = ((uchar *)_Var8._M_p)[2];
            _Var8._M_p = _Var8._M_p + 4;
            lVar13 = lVar13 + 1;
          } while (lVar13 < image->width);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < image->height);
    }
    if ((uchar *)local_198._M_dataplus._M_p != (uchar *)0x0) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if (1 < ds) {
      downscaleImage<unsigned_char>
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)local_1d0,image,ds);
      iVar7 = image->depth;
      image->depth = local_1d0._0_4_;
      local_1d0._0_4_ = iVar7;
      sVar3 = image->width;
      sVar4 = image->height;
      image->width = local_1d0._8_8_;
      image->height = local_1d0._16_8_;
      lVar11 = image->n;
      image->n = local_1d0._24_8_;
      puVar5 = image->pixel;
      ppuVar6 = image->row;
      image->pixel = local_1b0;
      image->row = ppuStack_1a8;
      pppuVar2 = image->img;
      image->img = local_1a0;
      local_1d0._8_8_ = sVar3;
      local_1d0._16_8_ = sVar4;
      local_1d0._24_8_ = lVar11;
      local_1b0 = puVar5;
      ppuStack_1a8 = ppuVar6;
      local_1a0 = pppuVar2;
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)local_1d0);
    }
    if (((y == 0 && x == 0) && (local_1f8 == image->width)) && (h == image->height))
    goto LAB_00139ee9;
    cropImage<unsigned_char>
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)local_1d0,image,x,y,
               local_1f8,h);
  }
  iVar7 = image->depth;
  image->depth = local_1d0._0_4_;
  local_1d0._0_4_ = iVar7;
  sVar3 = image->width;
  sVar4 = image->height;
  image->width = local_1d0._8_8_;
  image->height = local_1d0._16_8_;
  lVar11 = image->n;
  image->n = local_1d0._24_8_;
  puVar5 = image->pixel;
  ppuVar6 = image->row;
  image->pixel = local_1b0;
  image->row = ppuStack_1a8;
  pppuVar2 = image->img;
  image->img = local_1a0;
  local_1d0._8_8_ = sVar3;
  local_1d0._16_8_ = sVar4;
  local_1d0._24_8_ = lVar11;
  local_1b0 = puVar5;
  ppuStack_1a8 = ppuVar6;
  local_1a0 = pppuVar2;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
            ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)local_1d0);
LAB_00139ee9:
  anon_unknown_6::TiffImage<unsigned_char>::~TiffImage(&local_140);
  return;
}

Assistant:

void TIFFImageIO::load(ImageU8 &image, const char *name, int ds, long x, long y, long w, long h) const
{
  loadInternal(image, name, ds, x, y, w, h);
}